

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall Potassco::Application::printHelp(Application *this,OptionContext *root)

{
  OptionOutputImpl<Potassco::ProgramOptions::FileWriter,_Potassco::ProgramOptions::DefaultFormat>
  *pOVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  long *in_RDI;
  size_t in_stack_00000050;
  OptionContext *in_stack_00000058;
  FileOut out;
  DefaultFormat *in_stack_ffffffffffffff50;
  FileWriter *in_stack_ffffffffffffff58;
  string local_80 [24];
  OptionOutput *in_stack_ffffffffffffff98;
  OptionContext *in_stack_ffffffffffffffa0;
  FileWriter local_48 [9];
  
  pOVar1 = (OptionOutputImpl<Potassco::ProgramOptions::FileWriter,_Potassco::ProgramOptions::DefaultFormat>
            *)(**(code **)*in_RDI)();
  uVar2 = (**(code **)(*in_RDI + 8))();
  printf("%s version %s\n",pOVar1,uVar2);
  (**(code **)(*in_RDI + 0x58))();
  ProgramOptions::FileWriter::FileWriter(local_48,(FILE *)_stdout);
  ProgramOptions::
  OptionOutputImpl<Potassco::ProgramOptions::FileWriter,_Potassco::ProgramOptions::DefaultFormat>::
  OptionOutputImpl(pOVar1,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  ProgramOptions::OptionContext::description(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  printf("\n");
  (**(code **)(*in_RDI + 0x58))();
  uVar2 = (**(code **)*in_RDI)();
  pOVar1 = (OptionOutputImpl<Potassco::ProgramOptions::FileWriter,_Potassco::ProgramOptions::DefaultFormat>
            *)(**(code **)*in_RDI)();
  strlen((char *)pOVar1);
  ProgramOptions::OptionContext::defaults_abi_cxx11_(in_stack_00000058,in_stack_00000050);
  uVar3 = std::__cxx11::string::c_str();
  printf("Default command-line:\n%s %s\n",uVar2,uVar3);
  std::__cxx11::string::~string(local_80);
  fflush(_stdout);
  ProgramOptions::
  OptionOutputImpl<Potassco::ProgramOptions::FileWriter,_Potassco::ProgramOptions::DefaultFormat>::
  ~OptionOutputImpl(pOVar1);
  return;
}

Assistant:

void Application::printHelp(const OptionContext& root) {
	printf("%s version %s\n", getName(), getVersion());
	printUsage();
	ProgramOptions::FileOut out(stdout);
	root.description(out);
	printf("\n");
	printUsage();
	printf("Default command-line:\n%s %s\n", getName(), root.defaults(strlen(getName())+1).c_str());
	fflush(stdout);
}